

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

int __thiscall
cmCTestCoverageHandler::HandleLCovCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  pointer pcVar1;
  cmCTest *pcVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ostream *poVar8;
  long *plVar9;
  size_t sVar10;
  pointer pbVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  mapped_type *this_00;
  long lVar13;
  long *plVar14;
  size_type *psVar15;
  pointer piVar16;
  bool collapse;
  iterator __position;
  ulong uVar17;
  int retVal;
  string lcovFile;
  string nl;
  string actualSourceFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lcovFiles;
  string lineNumber;
  string daGlob;
  string output;
  string command;
  string srcname;
  string errors;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string sourceFile;
  string dir;
  string fileDir;
  string st2lcovOutputRex3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  ostringstream cmCTestLog_msg;
  string tempDir;
  string lcovExtraFlags;
  string lcovCommand;
  ostringstream cmCTestLog_msg_14;
  string testingDir;
  ostringstream cmCTestLog_msg_20;
  string currentDirectory;
  cmCTestCoverageHandlerLocale locale_C;
  Glob gl;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingFiles;
  RegularExpression st2re3;
  undefined1 auStack_a18 [11];
  char local_a0d;
  int local_a0c;
  cmCTestCoverageHandlerContainer *local_a08;
  int local_9fc;
  string *local_9f8;
  char *local_9f0;
  long local_9e8;
  char local_9e0;
  undefined7 uStack_9df;
  int local_9cc;
  string local_9c8;
  key_type local_9a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_988;
  long *local_970 [2];
  long local_960 [2];
  int local_94c;
  string local_948;
  string local_928;
  long *local_908;
  long local_900;
  long local_8f8;
  long lStack_8f0;
  string local_8e8;
  string local_8c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8a8;
  char *local_888;
  long local_880;
  char local_878;
  undefined7 uStack_877;
  undefined1 *local_868;
  undefined8 local_860;
  undefined1 local_858;
  undefined7 uStack_857;
  string local_848;
  long *local_828 [2];
  long local_818 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_808;
  undefined1 local_7e8 [32];
  byte abStack_7c8 [80];
  ios_base local_778 [408];
  long *local_5e0 [2];
  long local_5d0 [2];
  string local_5c0;
  string local_5a0;
  long *local_580;
  long local_578;
  long local_570;
  long lStack_568;
  byte abStack_560 [80];
  ios_base local_510 [408];
  pointer local_378;
  TotalCoverageMap *local_370;
  pointer local_368;
  string local_360;
  undefined1 local_340 [112];
  ios_base local_2d0 [264];
  string local_1c8;
  cmCTestCoverageHandlerLocale local_1a8;
  Glob local_188;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  RegularExpression local_100;
  
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  pcVar1 = local_7e8 + 0x10;
  local_a08 = cont;
  local_7e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"CoverageCommand","");
  cmCTest::GetCTestConfiguration(&local_5a0,pcVar2,(string *)local_7e8);
  if ((pointer)local_7e8._0_8_ != pcVar1) {
    operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
  }
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  local_7e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"CoverageExtraFlags","");
  cmCTest::GetCTestConfiguration(&local_5c0,pcVar2,(string *)local_7e8);
  if ((pointer)local_7e8._0_8_ != pcVar1) {
    operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_5a0);
  if (iVar5 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_7e8," Not a valid Intel Coverage command.",0x24);
    std::ios::widen((char)(ostream *)local_7e8 + (char)*(undefined8 *)(local_7e8._0_8_ + -0x18));
    std::ostream::put((char)local_7e8);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x5d3,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
    if (local_580 != &local_570) {
      operator_delete(local_580,local_570 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
    std::ios_base::~ios_base(local_778);
    iVar5 = 0;
    goto LAB_002834e0;
  }
  local_828[0] = local_818;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_828,"[0-9]+%","");
  local_100.program = (char *)0x0;
  if (local_828[0] != (long *)0x0) {
    cmsys::RegularExpression::compile(&local_100,(char *)local_828[0]);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_7e8," This is coverage command: ",0x1b);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_7e8,local_5a0._M_dataplus._M_p,local_5a0._M_string_length);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x5dc,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
  if (local_580 != &local_570) {
    operator_delete(local_580,local_570 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
  std::ios_base::~ios_base(local_778);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_7e8," These are coverage command flags: ",0x23);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_7e8,local_5c0._M_dataplus._M_p,local_5c0._M_string_length);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x5e0,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
  if (local_580 != &local_570) {
    operator_delete(local_580,local_570 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
  std::ios_base::~ios_base(local_778);
  local_8a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_8a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_8a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = FindLCovFiles(this,&local_8a8);
  if (bVar4) {
    if (local_8a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_8a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_7e8," Cannot find any LCov coverage files.",0x25);
      std::ios::widen((char)(ostream *)local_7e8 + (char)*(undefined8 *)(local_7e8._0_8_ + -0x18));
      std::ostream::put((char)local_7e8);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x5ef,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
      goto LAB_00283397;
    }
    cmCTest::GetBinaryDir_abi_cxx11_(&local_360,(this->super_cmCTestGenericHandler).CTest);
    local_5e0[0] = local_5d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_5e0,local_360._M_dataplus._M_p,
               local_360._M_dataplus._M_p + local_360._M_string_length);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_1c8,(SystemTools *)0x1,collapse);
    local_130._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_130._M_impl.super__Rb_tree_header._M_header;
    local_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_130._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
    local_130._M_impl.super__Rb_tree_header._M_header._M_right =
         local_130._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a8,"");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_7e8,"   Processing coverage (each . represents one file):",0x34);
    std::ios::widen((char)(ostream *)local_7e8 + (char)*(undefined8 *)(local_7e8._0_8_ + -0x18));
    std::ostream::put((char)local_7e8);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x5fc,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
    if (local_580 != &local_570) {
      operator_delete(local_580,local_570 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
    std::ios_base::~ios_base(local_778);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7e8,"    ",4);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x5fd,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
    if (local_580 != &local_570) {
      operator_delete(local_580,local_570 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
    std::ios_base::~ios_base(local_778);
    cmCTestCoverageHandlerLocale::cmCTestCoverageHandlerLocale(&local_1a8);
    local_9f8 = local_8a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    if (local_8a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_8a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_a0c = 0;
    }
    else {
      local_370 = &local_a08->TotalCoverage;
      local_a0c = 0;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7e8,".",1);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x609,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
        if (local_580 != &local_570) {
          operator_delete(local_580,local_570 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
        std::ios_base::~ios_base(local_778);
        cmsys::SystemTools::GetFilenamePath(&local_848,local_9f8);
        cmsys::SystemTools::ChangeDirectory(&local_848);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_340,"\"",&local_5a0);
        plVar9 = (long *)std::__cxx11::string::append((char *)local_340);
        plVar14 = plVar9 + 2;
        if ((long *)*plVar9 == plVar14) {
          local_570 = *plVar14;
          lStack_568 = plVar9[3];
          local_580 = &local_570;
        }
        else {
          local_570 = *plVar14;
          local_580 = (long *)*plVar9;
        }
        local_578 = plVar9[1];
        *plVar9 = (long)plVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_580,(ulong)local_5c0._M_dataplus._M_p);
        local_7e8._0_8_ = local_7e8 + 0x10;
        psVar15 = (size_type *)(plVar9 + 2);
        if ((size_type *)*plVar9 == psVar15) {
          local_7e8._16_8_ = *psVar15;
          local_7e8._24_8_ = plVar9[3];
        }
        else {
          local_7e8._16_8_ = *psVar15;
          local_7e8._0_8_ = (size_type *)*plVar9;
        }
        local_7e8._8_8_ = plVar9[1];
        *plVar9 = (long)psVar15;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append(local_7e8);
        local_908 = &local_8f8;
        plVar14 = plVar9 + 2;
        if ((long *)*plVar9 == plVar14) {
          local_8f8 = *plVar14;
          lStack_8f0 = plVar9[3];
        }
        else {
          local_8f8 = *plVar14;
          local_908 = (long *)*plVar9;
        }
        local_900 = plVar9[1];
        *plVar9 = (long)plVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
          operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
        }
        if (local_580 != &local_570) {
          operator_delete(local_580,local_570 + 1);
        }
        if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
          operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_7e8,"Current coverage dir: ",0x16);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_7e8,local_848._M_dataplus._M_p,
                            local_848._M_string_length);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x610,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
        if (local_580 != &local_570) {
          operator_delete(local_580,local_570 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
        std::ios_base::~ios_base(local_778);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
        plVar9 = local_908;
        if (local_908 == (long *)0x0) {
          std::ios::clear((int)auStack_a18 + (int)*(undefined8 *)(local_7e8._0_8_ + -0x18) + 0x230);
        }
        else {
          sVar10 = strlen((char *)local_908);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_7e8,(char *)plVar9,sVar10);
        }
        std::ios::widen((char)*(undefined8 *)(local_7e8._0_8_ + -0x18) + (char)local_7e8);
        std::ostream::put((char)local_7e8);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x612,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
        if (local_580 != &local_570) {
          operator_delete(local_580,local_570 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
        std::ios_base::~ios_base(local_778);
        local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_928,"","");
        local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,"","");
        local_9fc = 0;
        poVar8 = local_a08->OFS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"* Run coverage for: ",0x14);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_848._M_dataplus._M_p,local_848._M_string_length);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        poVar8 = local_a08->OFS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  Command: ",0xb);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)local_908,local_900);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        bVar4 = cmCTest::RunCommand((this->super_cmCTestGenericHandler).CTest,(char *)local_908,
                                    &local_928,&local_8c8,&local_9fc,local_848._M_dataplus._M_p,0.0)
        ;
        poVar8 = local_a08->OFS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  Output: ",10);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_928._M_dataplus._M_p,local_928._M_string_length);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        poVar8 = local_a08->OFS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  Errors: ",10);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_8c8._M_dataplus._M_p,local_8c8._M_string_length);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        if (bVar4) {
          if (local_9fc != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_7e8,"Coverage command returned: ",0x1b);
            poVar8 = (ostream *)std::ostream::operator<<(local_7e8,local_9fc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," while processing: ",0x13);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(local_9f8->_M_dataplus)._M_p,local_9f8->_M_string_length);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x62a,(char *)local_580,false);
            if (local_580 != &local_570) {
              operator_delete(local_580,local_570 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
            std::ios_base::~ios_base(local_778);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_7e8,"Command produced error: ",0x18);
            plVar9 = (long *)std::ostream::operator<<(local_7e8,local_a08->Error);
            std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
            std::ostream::put((char)plVar9);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x62c,(char *)local_580,false);
            if (local_580 != &local_570) {
              operator_delete(local_580,local_570 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
            std::ios_base::~ios_base(local_778);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_7e8,
                     "--------------------------------------------------------------",0x3e);
          std::ios::widen((char)*(undefined8 *)(local_7e8._0_8_ + -0x18) + (char)local_7e8);
          std::ostream::put((char)local_7e8);
          poVar8 = (ostream *)std::ostream::flush();
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_928._M_dataplus._M_p,local_928._M_string_length);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          poVar8 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"--------------------------------------------------------------",0x3e);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x633,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
          if (local_580 != &local_570) {
            operator_delete(local_580,local_570 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
          std::ios_base::~ios_base(local_778);
          local_808.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_808.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_808.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmSystemTools::Split(local_928._M_dataplus._M_p,&local_808);
          pbVar11 = local_808.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          while (pbVar11 !=
                 local_808.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
            local_888 = &local_878;
            local_880 = 0;
            local_878 = '\0';
            local_9f0 = &local_9e0;
            local_9e8 = 0;
            local_9e0 = '\0';
            local_378 = pbVar11;
            cmsys::Glob::Glob(&local_188);
            local_188.Recurse = true;
            local_188.RecurseThroughSymlinks = false;
            local_868 = &local_858;
            local_860 = 0;
            local_858 = 0;
            local_988.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_988.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_988.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            cmCTest::GetBinaryDir_abi_cxx11_
                      ((string *)local_7e8,(this->super_cmCTestGenericHandler).CTest);
            std::__cxx11::string::operator=((string *)&local_868,(string *)local_7e8);
            if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
              operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
            }
            local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
            local_948._M_string_length = 0;
            local_948.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::_M_assign((string *)&local_948);
            std::__cxx11::string::append((char *)&local_948);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_7e8,"   looking for LCOV files in: ",0x1e);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_7e8,local_948._M_dataplus._M_p,
                                local_948._M_string_length);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x650,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
            if (local_580 != &local_570) {
              operator_delete(local_580,local_570 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
            std::ios_base::~ios_base(local_778);
            cmsys::Glob::FindFiles(&local_188,&local_948,(GlobMessages *)0x0);
            pbVar3 = local_988.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pvVar12 = cmsys::Glob::GetFiles_abi_cxx11_(&local_188);
            pbVar11 = (pvVar12->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pvVar12 = cmsys::Glob::GetFiles_abi_cxx11_(&local_188);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_988,pbVar3,pbVar11,
                       (pvVar12->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
            local_9cc = 0;
            pbVar11 = local_988.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_988.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_988.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_a0d = '\x01';
            }
            else {
              do {
                local_368 = pbVar11;
                std::__cxx11::string::_M_assign((string *)&local_9f0);
                std::ifstream::ifstream((istream *)local_7e8,local_9f0,_S_in);
                if ((abStack_7c8[*(long *)(local_7e8._0_8_ + -0x18)] & 5) != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_580);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_580,"Cannot open file: ",0x12);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&local_580,local_9f0,local_9e8);
                  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar2,6,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x65e,(char *)local_340._0_8_,false);
                  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_580);
                  std::ios_base::~ios_base(local_510);
                }
                local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
                local_8e8._M_string_length = 0;
                local_8e8.field_2._M_local_buf[0] = '\0';
                local_a0d = cmsys::SystemTools::GetLineFromStream
                                      ((istream *)local_7e8,&local_8e8,(bool *)0x0,-1);
                if ((bool)local_a0d) {
                  std::__cxx11::string::substr((ulong)&local_580,(ulong)&local_8e8);
                  std::__cxx11::string::operator=((string *)&local_8e8,(string *)&local_580);
                  if (local_580 != &local_570) {
                    operator_delete(local_580,local_570 + 1);
                  }
                  std::__cxx11::string::_M_assign((string *)&local_888);
                  std::__cxx11::string::_M_assign((string *)&local_9a8);
                  for (pbVar11 = local_988.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                      pbVar11 !=
                      local_988.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar11 = pbVar11 + 1) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_580);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_580,"Found LCOV File: ",0x11);
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&local_580,(pbVar11->_M_dataplus)._M_p,
                                        pbVar11->_M_string_length);
                    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                    std::ostream::put((char)poVar8);
                    std::ostream::flush();
                    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar2,4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x674,(char *)local_340._0_8_,
                                 (this->super_cmCTestGenericHandler).Quiet);
                    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                      operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_580);
                    std::ios_base::~ios_base(local_510);
                  }
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_580);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_580,"SourceFile: ",0xc);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&local_580,local_888,local_880);
                  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar2,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x677,(char *)local_340._0_8_,
                               (this->super_cmCTestGenericHandler).Quiet);
                  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_580);
                  std::ios_base::~ios_base(local_510);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_580);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_580,"lCovFile: ",10);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&local_580,local_9f0,local_9e8);
                  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar2,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x679,(char *)local_340._0_8_,
                               (this->super_cmCTestGenericHandler).Quiet);
                  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_580);
                  std::ios_base::~ios_base(local_510);
                  if ((local_9e8 != 0) && ((char *)local_9a8._M_string_length != (char *)0x0)) {
                    this_00 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                              ::operator[](local_370,&local_9a8);
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_580);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_580,"   in lcovFile: ",0x10);
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&local_580,local_9f0,local_9e8);
                    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                    std::ostream::put((char)poVar8);
                    std::ostream::flush();
                    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar2,4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x682,(char *)local_340._0_8_,
                                 (this->super_cmCTestGenericHandler).Quiet);
                    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                      operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_580);
                    std::ios_base::~ios_base(local_510);
                    std::ifstream::ifstream((ostringstream *)&local_580,local_9f0,_S_in);
                    if ((abStack_560[local_580[-3]] & 5) == 0) {
                      local_9c8._M_dataplus._M_p = (pointer)&local_9c8.field_2;
                      local_9c8._M_string_length = 0;
                      local_9c8.field_2._M_local_buf[0] = '\0';
                      cmsys::SystemTools::GetLineFromStream
                                ((istream *)&local_580,&local_9c8,(bool *)0x0,-1);
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_340,"File is ready, start reading.",0x1d);
                      std::ios::widen((char)*(undefined8 *)(local_340._0_8_ + -0x18) +
                                      (char)local_340);
                      std::ostream::put((char)local_340);
                      std::ostream::flush();
                      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar2,4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x692,(char *)local_970[0],
                                   (this->super_cmCTestGenericHandler).Quiet);
                      if (local_970[0] != local_960) {
                        operator_delete(local_970[0],local_960[0] + 1);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
                      std::ios_base::~ios_base(local_2d0);
                      while (bVar4 = cmsys::SystemTools::GetLineFromStream
                                               ((istream *)&local_580,&local_9c8,(bool *)0x0,-1),
                            bVar4) {
                        if (0xb < local_9c8._M_string_length) {
                          std::__cxx11::string::substr((ulong)local_340,(ulong)&local_9c8);
                          iVar5 = atoi((char *)local_340._0_8_);
                          std::__cxx11::string::substr((ulong)local_970,(ulong)&local_9c8);
                          plVar9 = local_970[0];
                          iVar6 = atoi((char *)local_970[0]);
                          if (0 < iVar6) {
                            uVar17 = (ulong)(iVar6 - 1);
LAB_00282bd4:
                            piVar16 = (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start;
                            __position._M_current =
                                 (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish;
                            do {
                              if (uVar17 < (ulong)((long)__position._M_current - (long)piVar16 >> 2)
                                 ) {
                                iVar6 = piVar16[uVar17];
                                if (iVar6 < 0) {
                                  if (iVar5 < 1) {
                                    lVar13 = std::__cxx11::string::find(local_340,0x599b9b,0);
                                    piVar16 = (this_00->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_start;
                                    if (lVar13 == -1) {
                                      iVar6 = piVar16[uVar17];
                                      goto LAB_00282c5a;
                                    }
                                  }
                                  piVar16[uVar17] = 0;
                                  iVar6 = 0;
                                }
LAB_00282c5a:
                                piVar16[uVar17] = iVar6 + iVar5;
                                plVar9 = local_970[0];
                                break;
                              }
                              local_94c = -1;
                              if (__position._M_current ==
                                  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_end_of_storage) goto LAB_00282c0c;
                              *__position._M_current = -1;
                              __position._M_current = __position._M_current + 1;
                              (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish = __position._M_current;
                            } while( true );
                          }
                          if (plVar9 != local_960) {
                            operator_delete(plVar9,local_960[0] + 1);
                          }
                          if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                            operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                          }
                        }
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
                        operator_delete(local_9c8._M_dataplus._M_p,
                                        CONCAT71(local_9c8.field_2._M_allocated_capacity._1_7_,
                                                 local_9c8.field_2._M_local_buf[0]) + 1);
                      }
                    }
                    else {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_340,"Cannot open file: ",0x12);
                      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_340,local_9f0,local_9e8);
                      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                      std::ostream::put((char)poVar8);
                      std::ostream::flush();
                      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar2,6,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x688,local_9c8._M_dataplus._M_p,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
                        operator_delete(local_9c8._M_dataplus._M_p,
                                        CONCAT71(local_9c8.field_2._M_allocated_capacity._1_7_,
                                                 local_9c8.field_2._M_local_buf[0]) + 1);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
                      std::ios_base::~ios_base(local_2d0);
                    }
                    std::__cxx11::string::_M_replace
                              ((ulong)&local_9a8,0,(char *)local_9a8._M_string_length,0x5f43ef);
                    std::ifstream::~ifstream((ostringstream *)&local_580);
                  }
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_580);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_580,"Error while parsing lcov file \'",0x1f);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&local_580,local_9f0,local_9e8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\':",2);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8," No source file name found!",0x1b);
                  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar2,6,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x667,(char *)local_340._0_8_,false);
                  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_580);
                  std::ios_base::~ios_base(local_510);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
                  operator_delete(local_8e8._M_dataplus._M_p,
                                  CONCAT71(local_8e8.field_2._M_allocated_capacity._1_7_,
                                           local_8e8.field_2._M_local_buf[0]) + 1);
                }
                std::ifstream::~ifstream(local_7e8);
                if (local_a0d == '\0') {
                  local_9cc = 1;
                  break;
                }
                pbVar11 = local_368 + 1;
              } while (pbVar11 !=
                       local_988.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_948._M_dataplus._M_p != &local_948.field_2) {
              operator_delete(local_948._M_dataplus._M_p,
                              CONCAT71(local_948.field_2._M_allocated_capacity._1_7_,
                                       local_948.field_2._M_local_buf[0]) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_988);
            if (local_868 != &local_858) {
              operator_delete(local_868,CONCAT71(uStack_857,local_858) + 1);
            }
            cmsys::Glob::~Glob(&local_188);
            if (local_9f0 != &local_9e0) {
              operator_delete(local_9f0,CONCAT71(uStack_9df,local_9e0) + 1);
            }
            if (local_888 != &local_878) {
              operator_delete(local_888,CONCAT71(uStack_877,local_878) + 1);
            }
            iVar5 = local_9cc;
            if (local_a0d == '\0') goto LAB_002831c7;
            pbVar11 = local_378 + 1;
          }
          iVar5 = local_a0c * -0x3d70a3d7;
          local_a0c = local_a0c + 1;
          uVar7 = iVar5 + 0xc7ae1479;
          iVar5 = 0;
          if ((uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f) < 0x51eb851) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_7e8," processed: ",0xc);
            poVar8 = (ostream *)std::ostream::operator<<(local_7e8,local_a0c);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," out of ",8);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x6ce,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
            if (local_580 != &local_570) {
              operator_delete(local_580,local_570 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
            std::ios_base::~ios_base(local_778);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7e8,"    ",4);
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x6cf,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
            if (local_580 != &local_570) {
              operator_delete(local_580,local_570 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
            std::ios_base::~ios_base(local_778);
          }
LAB_002831c7:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_808);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_7e8,"Problem running coverage on file: ",0x22);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_7e8,(local_9f8->_M_dataplus)._M_p,
                              local_9f8->_M_string_length);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x621,(char *)local_580,false);
          if (local_580 != &local_570) {
            operator_delete(local_580,local_570 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
          std::ios_base::~ios_base(local_778);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_7e8,"Command produced error: ",0x18);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_7e8,local_8c8._M_dataplus._M_p,
                              local_8c8._M_string_length);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x623,(char *)local_580,false);
          if (local_580 != &local_570) {
            operator_delete(local_580,local_570 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
          std::ios_base::~ios_base(local_778);
          local_a08->Error = local_a08->Error + 1;
          iVar5 = 0x12;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
          operator_delete(local_8c8._M_dataplus._M_p,local_8c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_928._M_dataplus._M_p != &local_928.field_2) {
          operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
        }
        if (local_908 != &local_8f8) {
          operator_delete(local_908,local_8f8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_848._M_dataplus._M_p != &local_848.field_2) {
          operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
        }
        if ((iVar5 != 0x12) && (iVar5 != 0)) {
          iVar5 = 0;
          goto LAB_002833f9;
        }
        local_9f8 = local_9f8 + 1;
      } while (local_9f8 !=
               local_8a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    cmsys::SystemTools::ChangeDirectory(&local_1c8);
    iVar5 = local_a0c;
LAB_002833f9:
    cmCTestCoverageHandlerLocale::~cmCTestCoverageHandlerLocale(&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
      operator_delete(local_9a8._M_dataplus._M_p,local_9a8.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (local_5e0[0] != local_5d0) {
      operator_delete(local_5e0[0],local_5d0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_7e8,"Error while finding LCov files.\n",0x20);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x5e6,(char *)local_580,false);
LAB_00283397:
    if (local_580 != &local_570) {
      operator_delete(local_580,local_570 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
    std::ios_base::~ios_base(local_778);
    iVar5 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_8a8);
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  if (local_828[0] != local_818) {
    operator_delete(local_828[0],local_818[0] + 1);
  }
LAB_002834e0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
  }
  return iVar5;
LAB_00282c0c:
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,__position,&local_94c);
  goto LAB_00282bd4;
}

Assistant:

int cmCTestCoverageHandler::HandleLCovCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  std::string lcovCommand
    = this->CTest->GetCTestConfiguration("CoverageCommand");
  std::string lcovExtraFlags
    = this->CTest->GetCTestConfiguration("CoverageExtraFlags");
  if ( lcovCommand != "codecov" )
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               " Not a valid Intel Coverage command."
               << std::endl, this->Quiet);
    return 0;
    }
  // There is only percentage completed output from LCOV
  std::string st2lcovOutputRex3 = "[0-9]+%";
  cmsys::RegularExpression st2re3(st2lcovOutputRex3.c_str());

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
    " This is coverage command: " << lcovCommand
    << std::endl, this->Quiet);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
    " These are coverage command flags: " << lcovExtraFlags
    << std::endl, this->Quiet);

  std::vector<std::string> files;
  if (!this->FindLCovFiles(files))
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error while finding LCov files.\n");
    return 0;
    }
  std::vector<std::string>::iterator it;

  if (files.empty())
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
      " Cannot find any LCov coverage files."
      << std::endl, this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
    }
  std::string testingDir = this->CTest->GetBinaryDir();
  std::string tempDir = testingDir;
  std::string currentDirectory = cmSystemTools::GetCurrentWorkingDirectory();

  std::set<std::string> missingFiles;

  std::string actualSourceFile = "";
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
    "   Processing coverage (each . represents one file):" << std::endl,
    this->Quiet);
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
  int file_count = 0;

  // make sure output from lcov is in English!
  cmCTestCoverageHandlerLocale locale_C;
  static_cast<void>(locale_C);

  // In intel compiler we have to call codecov only once in each executable
  // directory. It collects all *.dyn files to generate .dpi file.
  for ( it = files.begin(); it != files.end(); ++ it )
    {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "." << std::flush,
      this->Quiet);
    std::string fileDir = cmSystemTools::GetFilenamePath(*it);
    cmSystemTools::ChangeDirectory(fileDir);
    std::string command = "\"" + lcovCommand + "\" " +
      lcovExtraFlags + " ";

    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
      "Current coverage dir: " << fileDir << std::endl, this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, command.c_str()
      << std::endl, this->Quiet);

    std::string output = "";
    std::string errors = "";
    int retVal = 0;
    *cont->OFS << "* Run coverage for: " << fileDir << std::endl;
    *cont->OFS << "  Command: " << command << std::endl;
    int res = this->CTest->RunCommand(command.c_str(), &output, &errors,
                &retVal, fileDir.c_str(), 0 /*this->TimeOut*/);

    *cont->OFS << "  Output: " << output << std::endl;
    *cont->OFS << "  Errors: " << errors << std::endl;
    if ( ! res )
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
        "Problem running coverage on file: " << *it << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
        "Command produced error: " << errors << std::endl);
      cont->Error ++;
      continue;
      }
    if ( retVal != 0 )
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Coverage command returned: "
        << retVal << " while processing: " << *it << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
        "Command produced error: " << cont->Error << std::endl);
      }
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
      "--------------------------------------------------------------"
      << std::endl
      << output << std::endl
      << "--------------------------------------------------------------"
      << std::endl, this->Quiet);

    std::vector<std::string> lines;
    std::vector<std::string>::iterator line;

    cmSystemTools::Split(output.c_str(), lines);

    for ( line = lines.begin(); line != lines.end(); ++line)
      {
      std::string sourceFile;
      std::string lcovFile;

      if (line->empty())
        {
        // Ignore empty line
        }
      // Look for LCOV files in binary directory
      // Intel Compiler creates a CodeCoverage dir for each subfolder and
      // each subfolder has LCOV files
      cmsys::Glob gl;
      gl.RecurseOn();
      gl.RecurseThroughSymlinksOff();
      std::string dir;
      std::vector<std::string> lcovFiles;
      dir = this->CTest->GetBinaryDir();
      std::string daGlob;
      daGlob = dir;
      daGlob += "/*.LCOV";
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
        "   looking for LCOV files in: " << daGlob << std::endl, this->Quiet);
      gl.FindFiles(daGlob);
      // Keep a list of all LCOV files
      lcovFiles.insert(lcovFiles.end(), gl.GetFiles().begin(),
                       gl.GetFiles().end());

      for(std::vector<std::string>::iterator a = lcovFiles.begin();
          a != lcovFiles.end(); ++a)
        {
        lcovFile = *a;
        cmsys::ifstream srcead(lcovFile.c_str());
        if ( ! srcead )
          {
          cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot open file: "
                     << lcovFile << std::endl);
          }
        std::string srcname;

        int success = cmSystemTools::GetLineFromStream(srcead, srcname);
        if ( !success )
          {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Error while parsing lcov file '" << lcovFile << "':"
                     << " No source file name found!" << std::endl);
          return 0;
          }
        srcname = srcname.substr(18);
        // We can directly read found LCOV files to determine the source
        // files
        sourceFile = srcname;
        actualSourceFile = srcname;

        for(std::vector<std::string>::iterator t = lcovFiles.begin();
            t != lcovFiles.end(); ++t)
          {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
            "Found LCOV File: " << *t << std::endl, this->Quiet);
          }
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "SourceFile: "
          << sourceFile << std::endl, this->Quiet);
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "lCovFile: "
        << lcovFile << std::endl, this->Quiet);

        // If we have some LCOV files to process
        if ( !lcovFile.empty() && !actualSourceFile.empty() )
          {
          cmCTestCoverageHandlerContainer::SingleFileCoverageVector& vec
            = cont->TotalCoverage[actualSourceFile];

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
            "   in lcovFile: " << lcovFile << std::endl, this->Quiet);

          cmsys::ifstream ifile(lcovFile.c_str());
          if ( ! ifile )
            {
            cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot open file: "
                       << lcovFile << std::endl);
            }
          else
            {
            long cnt = -1;
            std::string nl;

            // Skip the first line
            cmSystemTools::GetLineFromStream(ifile, nl);
            cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
              "File is ready, start reading." << std::endl, this->Quiet);
            while ( cmSystemTools::GetLineFromStream(ifile, nl) )
              {
              cnt ++;

              // Skip empty lines
              if (nl.empty())
                {
                continue;
                }

              // Skip unused lines
              if ( nl.size() < 12 )
                {
                continue;
                }

              // Read the coverage count from the beginning of the lcov
              // output line
              std::string prefix = nl.substr(0, 17);
              int cov = atoi(prefix.c_str());

              // Read the line number starting at the 17th character of the
              // lcov output line
              std::string lineNumber = nl.substr(17, 7);

              int lineIdx = atoi(lineNumber.c_str())-1;
              if ( lineIdx >= 0 )
                {
                while ( vec.size() <= static_cast<size_t>(lineIdx) )
                  {
                  vec.push_back(-1);
                  }

                // Initially all entries are -1 (not used). If we get coverage
                // information, increment it to 0 first.
                if ( vec[lineIdx] < 0 )
                  {
                  if ( cov > 0 || prefix.find("#") != prefix.npos )
                    {
                    vec[lineIdx] = 0;
                    }
                  }

                vec[lineIdx] += cov;
                }
              }
            }

          actualSourceFile = "";
          }
        }
      }

    file_count++;

    if ( file_count % 50 == 0 )
      {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
        " processed: " << file_count << " out of " << files.size()
        << std::endl, this->Quiet);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
      }
    }

  cmSystemTools::ChangeDirectory(currentDirectory);
  return file_count;
}